

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCoberturaCoverage.cxx
# Opt level: O1

void __thiscall cmParseCoberturaCoverage::XMLParser::EndElement(XMLParser *this,string *name)

{
  int iVar1;
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    this->InSource = false;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) {
      this->InSources = false;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 == 0) {
        this->SkipThisClass = false;
      }
    }
  }
  return;
}

Assistant:

void EndElement(const std::string& name) override
  {
    if (name == "source") {
      this->InSource = false;
    } else if (name == "sources") {
      this->InSources = false;
    } else if (name == "class") {
      this->SkipThisClass = false;
    }
  }